

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
getAscendingNumbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int inputSize)

{
  int local_1c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (local_1c = 0; local_1c < inputSize; local_1c = local_1c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_1c);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> getAscendingNumbers(int inputSize) {
    vector<int> ascendingNumbers;

    for (int i = 0; i < inputSize; i++) {
        ascendingNumbers.push_back(i);
    }
    return ascendingNumbers;
}